

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_base.c
# Opt level: O0

MPP_RET hal_vp8e_setup(void *hal)

{
  MPP_RET MVar1;
  HalVp8eCtx *ctx;
  MPP_RET ret;
  void *hal_local;
  
  MVar1 = set_parameter(hal);
  if (MVar1 == MPP_OK) {
    MVar1 = set_picbuf(hal);
    if (MVar1 == MPP_OK) {
      hal_local._4_4_ = alloc_buffer(hal);
    }
    else {
      _mpp_log_l(2,"hal_vp8e_base","set vp8e picbuf failed, no enough memory",(char *)0x0);
      hal_local._4_4_ = MPP_ERR_NOMEM;
    }
  }
  else {
    _mpp_log_l(2,"hal_vp8e_base","set vp8e parameter failed",(char *)0x0);
    hal_local._4_4_ = MPP_NOK;
  }
  return hal_local._4_4_;
}

Assistant:

MPP_RET hal_vp8e_setup(void *hal)
{
    MPP_RET ret = MPP_OK;
    HalVp8eCtx *ctx = (HalVp8eCtx *)hal;

    if (set_parameter(ctx)) {
        mpp_err("set vp8e parameter failed");
        return MPP_NOK;
    }

    if (set_picbuf(ctx)) {
        mpp_err("set vp8e picbuf failed, no enough memory");
        return MPP_ERR_NOMEM;
    }

    ret = alloc_buffer(ctx);

    return ret;
}